

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

TCGTemp * tcg_global_reg_new_internal
                    (TCGContext_conflict9 *s,TCGType_conflict type,TCGReg reg,char *name)

{
  TCGTemp *pTVar1;
  TCGTemp *ts;
  char *name_local;
  TCGReg reg_local;
  TCGType_conflict type_local;
  TCGContext_conflict9 *s_local;
  
  pTVar1 = tcg_global_alloc(s);
  *(ulong *)pTVar1 = *(ulong *)pTVar1 & 0xffffffffff00ffff | ((ulong)type & 0xff) << 0x10;
  *(ulong *)pTVar1 = *(ulong *)pTVar1 & 0xffffffff00ffffff | ((ulong)type & 0xff) << 0x18;
  *(ulong *)pTVar1 = *(ulong *)pTVar1 & 0xfffffffeffffffff | 0x100000000;
  *(ulong *)pTVar1 = *(ulong *)pTVar1 & 0xffffffffffffff00 | (ulong)reg & 0xff;
  pTVar1->name = name;
  s->reserved_regs = 1 << ((byte)reg & 0x1f) | s->reserved_regs;
  return pTVar1;
}

Assistant:

static TCGTemp *tcg_global_reg_new_internal(TCGContext *s, TCGType type,
                                            TCGReg reg, const char *name)
{
    TCGTemp *ts;

    if (TCG_TARGET_REG_BITS == 32 && type != TCG_TYPE_I32) {
        tcg_abort();
    }

    ts = tcg_global_alloc(s);
    ts->base_type = type;
    ts->type = type;
    ts->fixed_reg = 1;
    ts->reg = reg;
    ts->name = name;
    tcg_regset_set_reg(s->reserved_regs, reg);

    return ts;
}